

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O2

vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
* get_tensor_configs(vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
                     *__return_storage_ptr__,mt19937 *rng)

{
  undefined1 auVar1 [16];
  result_type rVar2;
  long lVar3;
  result_type rVar4;
  undefined8 uVar5;
  int i;
  int iVar6;
  ulong uVar7;
  array<long,_4UL> shape;
  pair<ggml_type,_std::array<long,_4UL>_> local_58;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<ggml_type,_std::array<long,_4UL>_>,_std::allocator<std::pair<ggml_type,_std::array<long,_4UL>_>_>_>
  ::reserve(__return_storage_ptr__,100);
  for (iVar6 = 0; iVar6 != 100; iVar6 = iVar6 + 1) {
    rVar2 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(rng);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rVar2;
    uVar5 = SUB168(auVar1 % ZEXT816(0x27),0);
    lVar3 = ggml_type_size(uVar5);
    if (lVar3 != 0) {
      shape._M_elems[2] = 1;
      shape._M_elems[3] = 1;
      shape._M_elems[0] = 1;
      shape._M_elems[1] = 1;
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      lVar3 = ggml_blck_size(uVar5);
      shape._M_elems[0] = lVar3 * (rVar2 % 10 + 1);
      rVar2 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(rng);
      for (uVar7 = 0; ((uint)rVar2 & 3) != uVar7; uVar7 = uVar7 + 1) {
        rVar4 = std::
                mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                ::operator()(rng);
        shape._M_elems[uVar7 + 1] = rVar4 % 10 + 1;
      }
      local_58.second._M_elems[2] = shape._M_elems[2];
      local_58.second._M_elems[3] = shape._M_elems[3];
      local_58.second._M_elems[0] = shape._M_elems[0];
      local_58.second._M_elems[1] = shape._M_elems[1];
      local_58.first = SUB164(auVar1 % ZEXT816(0x27),0);
      std::
      vector<std::pair<ggml_type,std::array<long,4ul>>,std::allocator<std::pair<ggml_type,std::array<long,4ul>>>>
      ::emplace_back<std::pair<ggml_type,std::array<long,4ul>>>
                ((vector<std::pair<ggml_type,std::array<long,4ul>>,std::allocator<std::pair<ggml_type,std::array<long,4ul>>>>
                  *)__return_storage_ptr__,&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<tensor_config_t> get_tensor_configs(std::mt19937 & rng) {
    std::vector<tensor_config_t> tensor_configs;
    tensor_configs.reserve(100);

    for (int i = 0; i < 100; ++i) {
        const enum ggml_type type = ggml_type(rng() % GGML_TYPE_COUNT);
        if (ggml_type_size(type) == 0) {
            continue;
        }

        std::array<int64_t, GGML_MAX_DIMS> shape = {1, 1, 1, 1};
        shape[0] = (1 + rng() % 10) * ggml_blck_size(type);
        const int n_dims = 1 + rng() % GGML_MAX_DIMS;
        for (int i = 1; i < n_dims; ++i) {
            shape[i] = 1 + rng() % 10;
        }

        tensor_configs.push_back(std::make_pair(type, shape));
    }

    return tensor_configs;
}